

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void __thiscall
slang::ast::SFormat::TypeVisitor::formatArray<slang::SVQueue>
          (TypeVisitor *this,Type *type,SVQueue *arr)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  TypeVisitor *pTVar1;
  char *pcVar2;
  byte *in_RDI;
  size_t i;
  Type *elemType;
  size_type in_stack_ffffffffffffff58;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_ffffffffffffff60;
  TypeVisitor *in_stack_ffffffffffffff68;
  FormatBuffer *in_stack_ffffffffffffff70;
  byte *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *pcVar3;
  char *local_38;
  
  pTVar1 = (TypeVisitor *)Type::getArrayElementType((Type *)in_stack_ffffffffffffff68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
             &in_stack_ffffffffffffff68->abbreviated);
  str._M_str = in_stack_ffffffffffffff80;
  str._M_len = (size_t)in_stack_ffffffffffffff78;
  FormatBuffer::append(in_stack_ffffffffffffff70,str);
  local_38 = (char *)0x0;
  while (pcVar3 = local_38,
        pcVar2 = (char *)std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
                         size((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                              0x12d4a99), pcVar3 < pcVar2) {
    if (local_38 != (char *)0x0) {
      in_stack_ffffffffffffff78 = in_RDI + 8;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
                 &in_stack_ffffffffffffff68->abbreviated);
      str_00._M_str = pcVar3;
      str_00._M_len = (size_t)in_stack_ffffffffffffff78;
      FormatBuffer::append(in_stack_ffffffffffffff70,str_00);
      if ((*in_RDI & 1) == 0) {
        in_stack_ffffffffffffff70 = (FormatBuffer *)(in_RDI + 8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
                   &in_stack_ffffffffffffff68->abbreviated);
        str_01._M_str = pcVar3;
        str_01._M_len = (size_t)in_stack_ffffffffffffff78;
        FormatBuffer::append(in_stack_ffffffffffffff70,str_01);
      }
    }
    in_stack_ffffffffffffff68 = pTVar1;
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::operator[]
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
              ((Symbol *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (ConstantValue *)in_stack_ffffffffffffff60);
    local_38 = local_38 + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
             &in_stack_ffffffffffffff68->abbreviated);
  str_02._M_str = pcVar3;
  str_02._M_len = (size_t)in_stack_ffffffffffffff78;
  FormatBuffer::append(in_stack_ffffffffffffff70,str_02);
  return;
}

Assistant:

void formatArray(const Type& type, const T& arr) {
        auto elemType = type.getArrayElementType();
        SLANG_ASSERT(elemType);

        buffer.append("'{");
        for (size_t i = 0; i < arr.size(); i++) {
            if (i != 0) {
                buffer.append(",");
                if (!abbreviated)
                    buffer.append(" ");
            }
            elemType->visit(*this, arr[i]);
        }
        buffer.append("}");
    }